

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O2

OPJ_BOOL opj_write_tile(opj_codec_t *p_codec,OPJ_UINT32 p_tile_index,OPJ_BYTE *p_data,
                       OPJ_UINT32 p_data_size,opj_stream_t *p_stream)

{
  OPJ_BOOL OVar1;
  
  if ((((p_data != (OPJ_BYTE *)0x0) && (p_codec != (opj_codec_t *)0x0)) &&
      (p_stream != (opj_stream_t *)0x0)) && (*(int *)(p_codec + 0x12) == 0)) {
    OVar1 = (*(code *)p_codec[2])(p_codec[0xb]);
    return OVar1;
  }
  return 0;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_write_tile(opj_codec_t *p_codec,
                                     OPJ_UINT32 p_tile_index,
                                     OPJ_BYTE * p_data,
                                     OPJ_UINT32 p_data_size,
                                     opj_stream_t *p_stream)
{
    if (p_codec && p_stream && p_data) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;
        opj_stream_private_t * l_stream = (opj_stream_private_t *) p_stream;

        if (l_codec->is_decompressor) {
            return OPJ_FALSE;
        }

        return l_codec->m_codec_data.m_compression.opj_write_tile(l_codec->m_codec,
                p_tile_index,
                p_data,
                p_data_size,
                l_stream,
                &(l_codec->m_event_mgr));
    }

    return OPJ_FALSE;
}